

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::DockContextCalcDropPosForDocking
               (ImGuiWindow *target,ImGuiDockNode *target_node,ImGuiWindow *payload,
               ImGuiDir split_dir,bool split_outer,ImVec2 *out_pos)

{
  ImVec2 IVar1;
  bool bVar2;
  undefined1 local_160 [8];
  ImGuiDockPreviewData split_data;
  ImVec2 *out_pos_local;
  bool split_outer_local;
  ImGuiDir split_dir_local;
  ImGuiWindow *payload_local;
  ImGuiDockNode *target_node_local;
  ImGuiWindow *target_local;
  
  split_data.DropRectsDraw[4].Max = (ImVec2)out_pos;
  out_pos_local._3_1_ = split_outer;
  if ((((target_node != (ImGuiDockNode *)0x0) && (target_node->ParentNode == (ImGuiDockNode *)0x0))
      && (bVar2 = ImGuiDockNode::IsCentralNode(target_node), bVar2)) && (split_dir != -1)) {
    out_pos_local._3_1_ = 1;
  }
  ImGuiDockPreviewData::ImGuiDockPreviewData((ImGuiDockPreviewData *)local_160);
  DockNodePreviewDockSetup
            (target,target_node,payload,(ImGuiDockPreviewData *)local_160,false,
             (bool)(out_pos_local._3_1_ & 1));
  bVar2 = ImRect::IsInverted((ImRect *)&split_data.DropRectsDraw[split_dir].Max);
  if (!bVar2) {
    IVar1 = ImRect::GetCenter((ImRect *)&split_data.DropRectsDraw[split_dir].Max);
    *(ImVec2 *)split_data.DropRectsDraw[4].Max = IVar1;
  }
  target_local._7_1_ = !bVar2;
  ImGuiDockPreviewData::~ImGuiDockPreviewData((ImGuiDockPreviewData *)local_160);
  return target_local._7_1_;
}

Assistant:

bool ImGui::DockContextCalcDropPosForDocking(ImGuiWindow* target, ImGuiDockNode* target_node, ImGuiWindow* payload, ImGuiDir split_dir, bool split_outer, ImVec2* out_pos)
{
    // In DockNodePreviewDockSetup() for a root central node instead of showing both "inner" and "outer" drop rects
    // (which would be functionally identical) we only show the outer one. Reflect this here.
    if (target_node && target_node->ParentNode == NULL && target_node->IsCentralNode() && split_dir != ImGuiDir_None)
        split_outer = true;
    ImGuiDockPreviewData split_data;
    DockNodePreviewDockSetup(target, target_node, payload, &split_data, false, split_outer);
    if (split_data.DropRectsDraw[split_dir+1].IsInverted())
        return false;
    *out_pos = split_data.DropRectsDraw[split_dir+1].GetCenter();
    return true;
}